

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>::
emplace_back<slang::ast::Expression_const&,slang::ast::ValueSymbol_const&>
          (SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState> *this,Expression *args,
          ValueSymbol *args_1)

{
  SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState> *in_RDI;
  ValueSymbol *unaff_retaddr;
  ValueSymbol *in_stack_00000028;
  Expression *in_stack_00000030;
  pointer in_stack_00000038;
  SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState> *in_stack_00000040;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::Expression_const&,slang::ast::ValueSymbol_const&>
                        (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  else {
    end(in_RDI);
    ast::UnrollVisitor::PerAssignDriverState::PerAssignDriverState
              ((PerAssignDriverState *)args,(Expression *)args_1,unaff_retaddr);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }